

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::FastSR1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  ulong *puVar4;
  SerialArena *this;
  __int_type_conflict _Var5;
  __pointer_type pSVar6;
  char cVar7;
  uint uVar8;
  Rep *pRVar9;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar10;
  string *psVar11;
  string *s;
  ulong uVar12;
  char *pcVar13;
  undefined8 extraout_RDX;
  ParseContext *extraout_RDX_00;
  ParseContext *ctx_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar14;
  undefined8 extraout_RDX_02;
  ParseContext *extraout_RDX_03;
  TcParseTableBase *pTVar15;
  ulong uVar16;
  uint *puVar17;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 *this_00;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 unaff_R13;
  TcParseTableBase *ptr_00;
  undefined1 auVar18 [16];
  pair<const_char_*,_int> pVar19;
  LogMessageFatal local_40 [16];
  
  if (data.field_0._0_1_ != '\0') {
    pcVar13 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar13;
  }
  this_00 = (anon_union_8_1_898a9ca8_for_TcFieldData_0 *)
            ((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)this_00 & 7) != 0) {
    AlignFail(this_00);
  }
  bVar1 = *ptr;
  puVar4 = (ulong *)this_00[2].data;
  if (puVar4 == (ulong *)0x0) {
LAB_00155cb1:
    do {
      ptr_00 = (TcParseTableBase *)((long)ptr + 1);
      s = (string *)RepeatedPtrFieldBase::AddString((RepeatedPtrFieldBase *)this_00);
      ptr = InlineGreedyStringParser(s,(char *)ptr_00,ctx);
      ctx_00 = extraout_RDX_03;
      if ((ushort *)ptr == (ushort *)0x0) goto LAB_00155d89;
      pVVar10 = RepeatedPtrFieldBase::
                Mutable<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                          ((RepeatedPtrFieldBase *)this_00,*(int *)(this_00 + 1) + -1);
      cVar7 = utf8_range::IsStructurallyValid(pVVar10->_M_string_length,(pVVar10->_M_dataplus)._M_p)
      ;
      if (cVar7 == '\0') {
        ReportFastUtf8Error((uint)bVar1,table);
      }
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) goto LAB_00155cfb;
    } while ((byte)*(ushort *)ptr == bVar1);
  }
  else {
    pTVar15 = (TcParseTableBase *)ptr;
    auVar18 = __tls_get_addr(&PTR_001b9f20);
    uVar14 = auVar18._8_8_;
    data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                   ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(auVar18._0_8_ + 8))->data;
    if (data.field_0.data != (anon_union_8_1_898a9ca8_for_TcFieldData_0)*puVar4) goto LAB_00155cb1;
    this = *(SerialArena **)(auVar18._0_8_ + 0x10);
    data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)this_00->data;
    if (((ulong)data.field_0 & 1) == 0) {
      uVar8 = (uint)(data.field_0.data != (anon_union_8_1_898a9ca8_for_TcFieldData_0)0x0);
    }
    else {
      pRVar9 = RepeatedPtrFieldBase::rep((RepeatedPtrFieldBase *)this_00);
      uVar8 = pRVar9->allocated_size;
      uVar14 = extraout_RDX;
    }
    if (uVar8 != *(uint *)(this_00 + 1)) goto LAB_00155cb1;
    do {
      bVar2 = *(byte *)((long)ptr + 1);
      ptr_00 = (TcParseTableBase *)(ulong)bVar2;
      uVar8 = (uint)bVar2;
      if ((char)bVar2 < '\0') {
        pVar19 = ReadSizeFallback((char *)((long)ptr + 1),(uint)bVar2);
        uVar8 = pVar19.second;
      }
      else {
        pVar19._8_8_ = uVar14;
        pVar19.first = (char *)((long)ptr + 2);
        ptr_00 = pTVar15;
      }
      ctx_00 = pVar19._8_8_;
      pTVar15 = (TcParseTableBase *)pVar19.first;
      if (pTVar15 == (TcParseTableBase *)0x0) {
        ptr = (char *)0x0;
      }
      else {
        _Var5 = (this->string_block_unused_).super___atomic_base<unsigned_long>._M_i;
        if (_Var5 != 0) {
          uVar12 = _Var5 - 0x20;
          (this->string_block_unused_).super___atomic_base<unsigned_long>._M_i = uVar12;
          pSVar6 = (this->string_block_)._M_b._M_p;
          uVar16 = (ulong)pSVar6->allocated_size_ - 0x10;
          if (uVar16 < uVar12) {
            psVar11 = absl::lts_20240722::log_internal::
                      MakeCheckOpString<unsigned_long,unsigned_long>
                                (uVar12,uVar16,"offset <= effective_size()");
          }
          else {
            psVar11 = (string *)0x0;
          }
          if (psVar11 != (string *)0x0) {
            absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                      (local_40,
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/string_block.h"
                       ,0xa2,*(undefined8 *)(psVar11 + 8),*(undefined8 *)psVar11);
            absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
          }
          unaff_R13.data = (long)&pSVar6[-1].next_ + _Var5;
        }
        data.field_0 = unaff_R13;
        if (_Var5 == 0) {
          data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                         SerialArena::AllocateFromStringBlockFallback(this);
        }
        *(uint64_t *)data.field_0 = (long)data.field_0 + 0x10;
        *(undefined8 *)((long)data.field_0 + 8) = 0;
        *(undefined1 *)((long)data.field_0 + 0x10) = 0;
        RepeatedPtrFieldBase::AddAllocatedForParse
                  ((RepeatedPtrFieldBase *)this_00,(void *)data.field_0);
        ptr = EpsCopyInputStream::ReadString
                        (&ctx->super_EpsCopyInputStream,(char *)pTVar15,uVar8,(string *)data.field_0
                        );
        ctx_00 = extraout_RDX_00;
        ptr_00 = pTVar15;
      }
      if ((ushort *)ptr == (ushort *)0x0) {
LAB_00155d89:
        pcVar13 = Error(msg,(char *)ptr_00,ctx_00,data,table,hasbits);
        return pcVar13;
      }
      pVVar10 = RepeatedPtrFieldBase::
                Mutable<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                          ((RepeatedPtrFieldBase *)this_00,*(int *)(this_00 + 1) + -1);
      pTVar15 = (TcParseTableBase *)(pVVar10->_M_dataplus)._M_p;
      cVar7 = utf8_range::IsStructurallyValid(pVVar10->_M_string_length);
      uVar14 = extraout_RDX_01;
      if (cVar7 == '\0') {
        pTVar15 = table;
        ReportFastUtf8Error((uint)bVar1,table);
        uVar14 = extraout_RDX_02;
      }
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) goto LAB_00155cfb;
    } while ((byte)*(ushort *)ptr == bVar1);
  }
  if (ptr < (ctx->super_EpsCopyInputStream).limit_end_) {
    uVar8 = (uint)table->fast_idx_mask & (uint)*(ushort *)ptr;
    if ((uVar8 & 7) == 0) {
      uVar12 = (ulong)(uVar8 & 0xfffffff8);
      pcVar13 = (char *)(**(code **)(&table[1].has_bits_offset + uVar12))
                                  (msg,ptr,ctx,
                                   (ulong)*(ushort *)ptr ^
                                   *(ulong *)(&table[1].fast_idx_mask + uVar12 * 2),table,hasbits);
      return pcVar13;
    }
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x44d);
  }
  uVar3 = table->has_bits_offset;
joined_r0x00155d0b:
  if ((ulong)uVar3 != 0) {
    puVar17 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)uVar3);
    if (((ulong)puVar17 & 3) != 0) {
      AlignFail();
    }
    *puVar17 = *puVar17 | (uint)hasbits;
  }
  return (char *)(ushort *)ptr;
LAB_00155cfb:
  uVar3 = table->has_bits_offset;
  goto joined_r0x00155d0b;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastSR1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedString<
      uint8_t, RepeatedPtrField<std::string>, kUtf8ValidateOnly>(
      PROTOBUF_TC_PARAM_PASS);
}